

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O1

void __thiscall FWeaponSlot::Sort(FWeaponSlot *this)

{
  undefined8 *puVar1;
  int iVar2;
  WeaponInfo *pWVar3;
  PClassWeapon *pPVar4;
  bool bVar5;
  undefined8 uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  
  if (1 < (int)(this->Weapons).Count) {
    uVar7 = 1;
    lVar8 = 0x10;
    do {
      pWVar3 = (this->Weapons).Array;
      iVar2 = pWVar3[uVar7].Position;
      pPVar4 = pWVar3[uVar7].Type;
      lVar9 = lVar8;
      uVar10 = uVar7;
      do {
        uVar11 = uVar10 - 1 & 0xffffffff;
        pWVar3 = (this->Weapons).Array;
        if (pWVar3[uVar11].Position <= iVar2) goto LAB_004af764;
        uVar6 = *(undefined8 *)&pWVar3[uVar11].Position;
        puVar1 = (undefined8 *)((long)&pWVar3->Type + lVar9);
        *puVar1 = pWVar3[uVar11].Type;
        puVar1[1] = uVar6;
        lVar9 = lVar9 + -0x10;
        bVar5 = 1 < (long)uVar10;
        uVar10 = uVar10 - 1;
      } while (bVar5);
      uVar10 = 0;
LAB_004af764:
      pWVar3 = (this->Weapons).Array;
      pWVar3[(int)uVar10].Type = pPVar4;
      pWVar3[(int)uVar10].Position = iVar2;
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 0x10;
    } while ((long)uVar7 < (long)(int)(this->Weapons).Count);
  }
  return;
}

Assistant:

void FWeaponSlot::Sort()
{
	// This does not use qsort(), because the sort should be stable, and
	// there is no guarantee that qsort() is stable. This insertion sort
	// should be fine.
	int i, j;

	for (i = 1; i < (int)Weapons.Size(); ++i)
	{
		int pos = Weapons[i].Position;
		PClassWeapon *type = Weapons[i].Type;
		for (j = i - 1; j >= 0 && Weapons[j].Position > pos; --j)
		{
			Weapons[j + 1] = Weapons[j];
		}
		Weapons[j + 1].Type = type;
		Weapons[j + 1].Position = pos;
	}
}